

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,char *filename)

{
  REF_INT node0;
  int node1;
  REF_NODE ref_node;
  double dVar1;
  double dVar2;
  uint uVar3;
  REF_DBL *scalar;
  long lVar4;
  undefined8 uVar5;
  REF_STATUS RVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  char *vars [2];
  
  ref_node = ref_grid->node;
  vars[0] = "s";
  vars[1] = "l";
  uVar3 = ref_node->max;
  if ((int)uVar3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x119f
           ,"ref_gather_volume_status_tec","malloc scalar of REF_DBL negative");
    RVar6 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((ulong)uVar3 << 4);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x119f,"ref_gather_volume_status_tec","malloc scalar of REF_DBL NULL");
      RVar6 = 2;
    }
    else {
      for (lVar4 = 0; (ulong)uVar3 * 2 != lVar4; lVar4 = lVar4 + 1) {
        scalar[lVar4] = 1.0;
      }
      uVar3 = ref_edge_create(&ref_edge,ref_grid);
      if (uVar3 == 0) {
        for (lVar4 = 0; lVar4 < ref_edge->n; lVar4 = lVar4 + 1) {
          node0 = ref_edge->e2n[lVar4 * 2];
          node1 = ref_edge->e2n[lVar4 * 2 + 1];
          uVar3 = ref_node_ratio(ref_node,node0,node1,&edge_ratio);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar7 = "ratio";
            uVar5 = 0x11a4;
            goto LAB_0013d532;
          }
          dVar1 = scalar[(long)node0 * 2];
          dVar2 = (scalar + (long)node0 * 2)[1];
          uVar8 = -(ulong)(dVar1 < edge_ratio);
          uVar9 = -(ulong)(edge_ratio < dVar2);
          scalar[(long)node0 * 2] = (REF_DBL)(~uVar8 & (ulong)edge_ratio | (ulong)dVar1 & uVar8);
          (scalar + (long)node0 * 2)[1] =
               (REF_DBL)(~uVar9 & (ulong)edge_ratio | (ulong)dVar2 & uVar9);
          dVar1 = scalar[(long)node1 * 2];
          dVar2 = (scalar + (long)node1 * 2)[1];
          uVar8 = -(ulong)(dVar1 < edge_ratio);
          uVar9 = -(ulong)(edge_ratio < dVar2);
          scalar[(long)node1 * 2] = (REF_DBL)(~uVar8 & (ulong)edge_ratio | (ulong)dVar1 & uVar8);
          (scalar + (long)node1 * 2)[1] =
               (REF_DBL)(~uVar9 & (ulong)edge_ratio | (ulong)dVar2 & uVar9);
        }
        uVar3 = ref_edge_free(ref_edge);
        if (uVar3 == 0) {
          uVar3 = ref_gather_scalar_by_extension(ref_grid,2,scalar,vars,filename);
          if (uVar3 == 0) {
            free(scalar);
            return 0;
          }
          uVar8 = (ulong)uVar3;
          pcVar7 = "dump";
          uVar5 = 0x11ad;
        }
        else {
          uVar8 = (ulong)uVar3;
          pcVar7 = "free edges";
          uVar5 = 0x11aa;
        }
      }
      else {
        uVar8 = (ulong)uVar3;
        pcVar7 = "create edges";
        uVar5 = 0x11a0;
      }
LAB_0013d532:
      RVar6 = (REF_STATUS)uVar8;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar5,"ref_gather_volume_status_tec",uVar8,pcVar7);
    }
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL *scalar, edge_ratio;
  const char *vars[2];
  REF_INT ldim = 2;

  vars[0] = "s";
  vars[1] = "l";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[0 + ldim * node0] = MIN(scalar[0 + ldim * node0], edge_ratio);
    scalar[0 + ldim * node1] = MIN(scalar[0 + ldim * node1], edge_ratio);
    scalar[1 + ldim * node0] = MAX(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MAX(scalar[1 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_by_extension(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}